

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_properties(AMQP_VALUE value,PROPERTIES_HANDLE *properties_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  PROPERTIES_HANDLE pPVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  amqp_binary user_id;
  uint local_3c;
  amqp_binary local_38;
  
  pPVar4 = (PROPERTIES_HANDLE)malloc(8);
  if (pPVar4 == (PROPERTIES_HANDLE)0x0) {
    *properties_handle = (PROPERTIES_HANDLE)0x0;
    iVar3 = 0x3d3c;
  }
  else {
    pPVar4->composite_value = (AMQP_VALUE)0x0;
    *properties_handle = pPVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      properties_destroy(*properties_handle);
      iVar3 = 0x3d44;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_3c);
      iVar3 = 0x3d4b;
      if (iVar1 == 0) {
        if (local_3c != 0) {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 != (AMQP_VALUE)0x0) {
            amqpvalue_destroy(pAVar6);
          }
          if (1 < local_3c) {
            pAVar6 = amqpvalue_get_list_item(pAVar5,1);
            if (pAVar6 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar6);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar3 = amqpvalue_get_binary(pAVar6,&local_38), iVar3 != 0)) {
                amqpvalue_destroy(pAVar6);
                properties_destroy(*properties_handle);
                return 0x3d74;
              }
              amqpvalue_destroy(pAVar6);
            }
            if (2 < local_3c) {
              pAVar6 = amqpvalue_get_list_item(pAVar5,2);
              if (pAVar6 != (AMQP_VALUE)0x0) {
                amqpvalue_destroy(pAVar6);
              }
              if (3 < local_3c) {
                pAVar6 = amqpvalue_get_list_item(pAVar5,3);
                if (pAVar6 != (AMQP_VALUE)0x0) {
                  AVar2 = amqpvalue_get_type(pAVar6);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar3 = amqpvalue_get_string(pAVar6,(char **)&local_38), iVar3 != 0)) {
                    amqpvalue_destroy(pAVar6);
                    properties_destroy(*properties_handle);
                    return 0x3d9e;
                  }
                  amqpvalue_destroy(pAVar6);
                }
                if (4 < local_3c) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,4);
                  if (pAVar6 != (AMQP_VALUE)0x0) {
                    amqpvalue_destroy(pAVar6);
                  }
                  if (5 < local_3c) {
                    pAVar6 = amqpvalue_get_list_item(pAVar5,5);
                    if (pAVar6 != (AMQP_VALUE)0x0) {
                      amqpvalue_destroy(pAVar6);
                    }
                    if (6 < local_3c) {
                      pAVar6 = amqpvalue_get_list_item(pAVar5,6);
                      if (pAVar6 != (AMQP_VALUE)0x0) {
                        AVar2 = amqpvalue_get_type(pAVar6);
                        if ((AVar2 != AMQP_TYPE_NULL) &&
                           (iVar3 = amqpvalue_get_symbol(pAVar6,(char **)&local_38), iVar3 != 0)) {
                          amqpvalue_destroy(pAVar6);
                          properties_destroy(*properties_handle);
                          return 0x3dd5;
                        }
                        amqpvalue_destroy(pAVar6);
                      }
                      if (7 < local_3c) {
                        pAVar6 = amqpvalue_get_list_item(pAVar5,7);
                        if (pAVar6 != (AMQP_VALUE)0x0) {
                          AVar2 = amqpvalue_get_type(pAVar6);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar3 = amqpvalue_get_symbol(pAVar6,(char **)&local_38), iVar3 != 0))
                          {
                            amqpvalue_destroy(pAVar6);
                            properties_destroy(*properties_handle);
                            return 0x3df2;
                          }
                          amqpvalue_destroy(pAVar6);
                        }
                        if (8 < local_3c) {
                          pAVar6 = amqpvalue_get_list_item(pAVar5,8);
                          if (pAVar6 != (AMQP_VALUE)0x0) {
                            AVar2 = amqpvalue_get_type(pAVar6);
                            if ((AVar2 != AMQP_TYPE_NULL) &&
                               (iVar3 = amqpvalue_get_timestamp(pAVar6,(int64_t *)&local_38),
                               iVar3 != 0)) {
                              amqpvalue_destroy(pAVar6);
                              properties_destroy(*properties_handle);
                              return 0x3e0f;
                            }
                            amqpvalue_destroy(pAVar6);
                          }
                          if (9 < local_3c) {
                            pAVar6 = amqpvalue_get_list_item(pAVar5,9);
                            if (pAVar6 != (AMQP_VALUE)0x0) {
                              AVar2 = amqpvalue_get_type(pAVar6);
                              if ((AVar2 != AMQP_TYPE_NULL) &&
                                 (iVar3 = amqpvalue_get_timestamp(pAVar6,(int64_t *)&local_38),
                                 iVar3 != 0)) {
                                amqpvalue_destroy(pAVar6);
                                properties_destroy(*properties_handle);
                                return 0x3e2c;
                              }
                              amqpvalue_destroy(pAVar6);
                            }
                            if (10 < local_3c) {
                              pAVar6 = amqpvalue_get_list_item(pAVar5,10);
                              if (pAVar6 != (AMQP_VALUE)0x0) {
                                AVar2 = amqpvalue_get_type(pAVar6);
                                if ((AVar2 != AMQP_TYPE_NULL) &&
                                   (iVar3 = amqpvalue_get_string(pAVar6,(char **)&local_38),
                                   iVar3 != 0)) {
                                  amqpvalue_destroy(pAVar6);
                                  properties_destroy(*properties_handle);
                                  return 0x3e49;
                                }
                                amqpvalue_destroy(pAVar6);
                              }
                              if (0xb < local_3c) {
                                pAVar6 = amqpvalue_get_list_item(pAVar5,0xb);
                                if (pAVar6 != (AMQP_VALUE)0x0) {
                                  AVar2 = amqpvalue_get_type(pAVar6);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar3 = amqpvalue_get_uint(pAVar6,(uint32_t *)&local_38),
                                     iVar3 != 0)) {
                                    amqpvalue_destroy(pAVar6);
                                    properties_destroy(*properties_handle);
                                    return 0x3e66;
                                  }
                                  amqpvalue_destroy(pAVar6);
                                }
                                if ((0xc < local_3c) &&
                                   (pAVar5 = amqpvalue_get_list_item(pAVar5,0xc),
                                   pAVar5 != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(pAVar5);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar3 = amqpvalue_get_string(pAVar5,(char **)&local_38),
                                     iVar3 != 0)) {
                                    amqpvalue_destroy(pAVar5);
                                    properties_destroy(*properties_handle);
                                    return 0x3e83;
                                  }
                                  amqpvalue_destroy(pAVar5);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pAVar5 = amqpvalue_clone(value);
        pPVar4->composite_value = pAVar5;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_properties(AMQP_VALUE value, PROPERTIES_HANDLE* properties_handle)
{
    int result;
    PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties_create_internal();
    *properties_handle = properties_instance;
    if (*properties_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            properties_destroy(*properties_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* message-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* user-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                amqp_binary user_id;
                                if (amqpvalue_get_binary(item_value, &user_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* to */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* subject */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* subject;
                                if (amqpvalue_get_string(item_value, &subject) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* reply-to */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* correlation-id */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* content-type */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* content_type;
                                if (amqpvalue_get_symbol(item_value, &content_type) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* content-encoding */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* content_encoding;
                                if (amqpvalue_get_symbol(item_value, &content_encoding) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* absolute-expiry-time */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                timestamp absolute_expiry_time;
                                if (amqpvalue_get_timestamp(item_value, &absolute_expiry_time) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* creation-time */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                timestamp creation_time;
                                if (amqpvalue_get_timestamp(item_value, &creation_time) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* group-id */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* group_id;
                                if (amqpvalue_get_string(item_value, &group_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* group-sequence */
                    if (list_item_count > 11)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 11);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no group_sequence;
                                if (amqpvalue_get_sequence_no(item_value, &group_sequence) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* reply-to-group-id */
                    if (list_item_count > 12)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 12);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* reply_to_group_id;
                                if (amqpvalue_get_string(item_value, &reply_to_group_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    properties_destroy(*properties_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    properties_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}